

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O2

void __thiscall flatbuffers::cpp::CppGenerator::GenUnionPost(CppGenerator *this,EnumDef *enum_def)

{
  CodeWriter *pCVar1;
  BaseType BVar2;
  EnumVal *enum_val;
  StructDef *pSVar3;
  FieldDef *pFVar4;
  CppGenerator *pCVar5;
  FieldDef **field;
  pointer ppFVar6;
  EnumVal *pEVar7;
  pointer ppEVar8;
  string *psVar9;
  EnumDef *pEVar10;
  string local_ab0;
  CppGenerator *local_a90;
  allocator<char> local_a81;
  CodeWriter *local_a80;
  EnumDef *local_a78;
  string local_a70;
  EnumVal *local_a50;
  allocator<char> local_a41;
  IDLOptions *local_a40;
  string local_a38;
  pointer local_a18;
  string local_a10;
  string local_9f0;
  string local_9d0;
  string local_9b0;
  string local_990;
  string local_970;
  string local_950;
  string local_930;
  string local_910;
  string local_8f0;
  string local_8d0;
  string local_8b0;
  string local_890;
  string local_870;
  string local_850;
  string local_830;
  string local_810;
  string local_7f0;
  string local_7d0;
  string local_7b0;
  string local_790;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_770;
  string local_750;
  string local_730;
  string local_710;
  string local_6f0;
  string local_6d0;
  string local_6b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_690;
  string local_670;
  string local_650;
  string local_630;
  string local_610;
  string local_5f0;
  string local_5d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_590;
  string local_570;
  string local_550;
  string local_530;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_510;
  string local_4f0;
  string local_4d0;
  string local_4b0;
  string local_490;
  string local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ab0,"ENUM_NAME",(allocator<char> *)&local_a38);
  EscapeKeyword(&local_a70,this,(string *)enum_def);
  pCVar1 = &this->code_;
  CodeWriter::SetValue(pCVar1,&local_ab0,&local_a70);
  std::__cxx11::string::~string((string *)&local_a70);
  std::__cxx11::string::~string((string *)&local_ab0);
  UnionVerifySignature_abi_cxx11_(&local_a70,this,enum_def);
  std::operator+(&local_ab0,"inline ",&local_a70);
  std::operator+(&local_450,&local_ab0," {");
  CodeWriter::operator+=(pCVar1,&local_450);
  std::__cxx11::string::~string((string *)&local_450);
  std::__cxx11::string::~string((string *)&local_ab0);
  std::__cxx11::string::~string((string *)&local_a70);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_470,"  switch (type) {",(allocator<char> *)&local_ab0);
  local_a80 = pCVar1;
  CodeWriter::operator+=(pCVar1,&local_470);
  std::__cxx11::string::~string((string *)&local_470);
  local_a40 = &(this->opts_).super_IDLOptions;
  pEVar7 = (EnumVal *)
           (enum_def->vals).vec.
           super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_a90 = this;
  local_a78 = enum_def;
  while (pEVar7 != (EnumVal *)
                   (local_a78->vals).vec.
                   super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish) {
    enum_val = (EnumVal *)(pEVar7->name)._M_dataplus._M_p;
    local_a50 = pEVar7;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_ab0,"LABEL",(allocator<char> *)&local_a38);
    GetEnumValUse_abi_cxx11_(&local_a70,local_a90,local_a78,enum_val);
    CodeWriter::SetValue(local_a80,&local_ab0,&local_a70);
    std::__cxx11::string::~string((string *)&local_a70);
    std::__cxx11::string::~string((string *)&local_ab0);
    if (enum_val->value == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_130,"    case {{LABEL}}: {",(allocator<char> *)&local_ab0);
      CodeWriter::operator+=(local_a80,&local_130);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_150,"      return true;",(allocator<char> *)&local_ab0);
      CodeWriter::operator+=(local_a80,&local_150);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_170,"    }",(allocator<char> *)&local_ab0);
      CodeWriter::operator+=(local_a80,&local_170);
      std::__cxx11::string::~string((string *)&local_170);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_ab0,"TYPE",(allocator<char> *)&local_a38);
      GetUnionElement_abi_cxx11_(&local_a70,local_a90,enum_val,false,local_a40);
      CodeWriter::SetValue(local_a80,&local_ab0,&local_a70);
      std::__cxx11::string::~string((string *)&local_a70);
      std::__cxx11::string::~string((string *)&local_ab0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"    case {{LABEL}}: {",(allocator<char> *)&local_ab0);
      CodeWriter::operator+=(local_a80,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      BVar2 = (enum_val->union_type).base_type;
      if (BVar2 == BASE_TYPE_STRING) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d0,"      auto ptr = reinterpret_cast<const {{TYPE}} *>(obj);",
                   (allocator<char> *)&local_ab0);
        CodeWriter::operator+=(local_a80,&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
        psVar9 = &local_f0;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)psVar9,"      return verifier.VerifyString(ptr);",
                   (allocator<char> *)&local_ab0);
        CodeWriter::operator+=(local_a80,psVar9);
      }
      else {
        if (BVar2 != BASE_TYPE_STRUCT) {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_cpp.cpp"
                        ,0x652,"void flatbuffers::cpp::CppGenerator::GenUnionPost(const EnumDef &)")
          ;
        }
        if (((enum_val->union_type).struct_def)->fixed == true) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_ab0,"ALIGN",(allocator<char> *)&local_a38);
          NumToString<unsigned_long>(&local_a70,((enum_val->union_type).struct_def)->minalign);
          CodeWriter::SetValue(local_a80,&local_ab0,&local_a70);
          std::__cxx11::string::~string((string *)&local_a70);
          std::__cxx11::string::~string((string *)&local_ab0);
          psVar9 = &local_70;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)psVar9,
                     "      return verifier.VerifyField<{{TYPE}}>(static_cast<const uint8_t *>(obj), 0, {{ALIGN}});"
                     ,(allocator<char> *)&local_ab0);
          CodeWriter::operator+=(local_a80,psVar9);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_90,"      auto ptr = reinterpret_cast<const {{TYPE}} *>(obj);"
                     ,(allocator<char> *)&local_ab0);
          CodeWriter::operator+=(local_a80,&local_90);
          std::__cxx11::string::~string((string *)&local_90);
          psVar9 = &local_b0;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)psVar9,"      return verifier.VerifyTable(ptr);",
                     (allocator<char> *)&local_ab0);
          CodeWriter::operator+=(local_a80,psVar9);
        }
      }
      std::__cxx11::string::~string((string *)psVar9);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_110,"    }",(allocator<char> *)&local_ab0);
      CodeWriter::operator+=(local_a80,&local_110);
      std::__cxx11::string::~string((string *)&local_110);
    }
    pEVar7 = (EnumVal *)&(local_a50->name)._M_string_length;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_490,"    default: return true;",(allocator<char> *)&local_ab0);
  pCVar1 = local_a80;
  CodeWriter::operator+=(local_a80,&local_490);
  pEVar10 = local_a78;
  pCVar5 = local_a90;
  std::__cxx11::string::~string((string *)&local_490);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4b0,"  }",(allocator<char> *)&local_ab0);
  CodeWriter::operator+=(pCVar1,&local_4b0);
  std::__cxx11::string::~string((string *)&local_4b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4d0,"}",(allocator<char> *)&local_ab0);
  CodeWriter::operator+=(pCVar1,&local_4d0);
  std::__cxx11::string::~string((string *)&local_4d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4f0,"",(allocator<char> *)&local_ab0);
  CodeWriter::operator+=(pCVar1,&local_4f0);
  std::__cxx11::string::~string((string *)&local_4f0);
  UnionVectorVerifySignature_abi_cxx11_(&local_a70,pCVar5,pEVar10);
  std::operator+(&local_ab0,"inline ",&local_a70);
  std::operator+(&local_510,&local_ab0," {");
  CodeWriter::operator+=(pCVar1,&local_510);
  std::__cxx11::string::~string((string *)&local_510);
  std::__cxx11::string::~string((string *)&local_ab0);
  std::__cxx11::string::~string((string *)&local_a70);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_530,"  if (!values || !types) return !values && !types;",
             (allocator<char> *)&local_ab0);
  CodeWriter::operator+=(pCVar1,&local_530);
  std::__cxx11::string::~string((string *)&local_530);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_550,"  if (values->size() != types->size()) return false;",
             (allocator<char> *)&local_ab0);
  CodeWriter::operator+=(pCVar1,&local_550);
  std::__cxx11::string::~string((string *)&local_550);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_570,
             "  for (::flatbuffers::uoffset_t i = 0; i < values->size(); ++i) {",
             (allocator<char> *)&local_ab0);
  CodeWriter::operator+=(pCVar1,&local_570);
  std::__cxx11::string::~string((string *)&local_570);
  EscapeKeyword(&local_a70,pCVar5,(string *)pEVar10);
  std::operator+(&local_ab0,"    if (!Verify",&local_a70);
  std::operator+(&local_590,&local_ab0,"(");
  CodeWriter::operator+=(pCVar1,&local_590);
  std::__cxx11::string::~string((string *)&local_590);
  std::__cxx11::string::~string((string *)&local_ab0);
  std::__cxx11::string::~string((string *)&local_a70);
  EscapeKeyword(&local_a70,pCVar5,(string *)pEVar10);
  std::operator+(&local_ab0,"        verifier,  values->Get(i), types->GetEnum<",&local_a70);
  std::operator+(&local_5b0,&local_ab0,">(i))) {");
  CodeWriter::operator+=(pCVar1,&local_5b0);
  std::__cxx11::string::~string((string *)&local_5b0);
  std::__cxx11::string::~string((string *)&local_ab0);
  std::__cxx11::string::~string((string *)&local_a70);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5d0,"      return false;",(allocator<char> *)&local_ab0);
  CodeWriter::operator+=(pCVar1,&local_5d0);
  std::__cxx11::string::~string((string *)&local_5d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5f0,"    }",(allocator<char> *)&local_ab0);
  CodeWriter::operator+=(pCVar1,&local_5f0);
  std::__cxx11::string::~string((string *)&local_5f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_610,"  }",(allocator<char> *)&local_ab0);
  CodeWriter::operator+=(pCVar1,&local_610);
  std::__cxx11::string::~string((string *)&local_610);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_630,"  return true;",(allocator<char> *)&local_ab0);
  CodeWriter::operator+=(pCVar1,&local_630);
  std::__cxx11::string::~string((string *)&local_630);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_650,"}",(allocator<char> *)&local_ab0);
  CodeWriter::operator+=(pCVar1,&local_650);
  std::__cxx11::string::~string((string *)&local_650);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_670,"",(allocator<char> *)&local_ab0);
  CodeWriter::operator+=(pCVar1,&local_670);
  std::__cxx11::string::~string((string *)&local_670);
  if ((pCVar5->opts_).super_IDLOptions.generate_object_based_api == true) {
    UnionUnPackSignature_abi_cxx11_(&local_a70,pCVar5,pEVar10,false);
    std::operator+(&local_ab0,"inline ",&local_a70);
    std::operator+(&local_690,&local_ab0," {");
    CodeWriter::operator+=(pCVar1,&local_690);
    std::__cxx11::string::~string((string *)&local_690);
    std::__cxx11::string::~string((string *)&local_ab0);
    std::__cxx11::string::~string((string *)&local_a70);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6b0,"  (void)resolver;",(allocator<char> *)&local_ab0);
    CodeWriter::operator+=(pCVar1,&local_6b0);
    std::__cxx11::string::~string((string *)&local_6b0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6d0,"  switch (type) {",(allocator<char> *)&local_ab0);
    CodeWriter::operator+=(pCVar1,&local_6d0);
    std::__cxx11::string::~string((string *)&local_6d0);
    ppEVar8 = (pEVar10->vals).vec.
              super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    for (; ppEVar8 !=
           (pEVar10->vals).vec.
           super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
           _M_impl.super__Vector_impl_data._M_finish; ppEVar8 = ppEVar8 + 1) {
      pEVar7 = *ppEVar8;
      if (pEVar7->value != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_ab0,"LABEL",(allocator<char> *)&local_a38);
        GetEnumValUse_abi_cxx11_(&local_a70,local_a90,local_a78,pEVar7);
        CodeWriter::SetValue(pCVar1,&local_ab0,&local_a70);
        std::__cxx11::string::~string((string *)&local_a70);
        std::__cxx11::string::~string((string *)&local_ab0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_ab0,"TYPE",(allocator<char> *)&local_a38);
        GetUnionElement_abi_cxx11_(&local_a70,local_a90,pEVar7,false,local_a40);
        CodeWriter::SetValue(pCVar1,&local_ab0,&local_a70);
        std::__cxx11::string::~string((string *)&local_a70);
        std::__cxx11::string::~string((string *)&local_ab0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_190,"    case {{LABEL}}: {",(allocator<char> *)&local_ab0);
        CodeWriter::operator+=(pCVar1,&local_190);
        std::__cxx11::string::~string((string *)&local_190);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1b0,"      auto ptr = reinterpret_cast<const {{TYPE}} *>(obj);",
                   (allocator<char> *)&local_ab0);
        CodeWriter::operator+=(pCVar1,&local_1b0);
        std::__cxx11::string::~string((string *)&local_1b0);
        BVar2 = (pEVar7->union_type).base_type;
        if (BVar2 == BASE_TYPE_STRING) {
          psVar9 = &local_210;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)psVar9,"      return new std::string(ptr->c_str(), ptr->size());",
                     (allocator<char> *)&local_ab0);
          CodeWriter::operator+=(pCVar1,psVar9);
        }
        else {
          if (BVar2 != BASE_TYPE_STRUCT) {
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_cpp.cpp"
                          ,0x687,
                          "void flatbuffers::cpp::CppGenerator::GenUnionPost(const EnumDef &)");
          }
          pSVar3 = (pEVar7->union_type).struct_def;
          if (pSVar3->fixed == true) {
            psVar9 = &local_a38;
            std::__cxx11::string::string<std::allocator<char>>((string *)psVar9,"",&local_a81);
            BaseGenerator::WrapInNameSpace
                      (&local_a70,&local_a90->super_BaseGenerator,&pSVar3->super_Definition,psVar9);
            std::operator+(&local_ab0,"      return new ",&local_a70);
            std::operator+(&local_1d0,&local_ab0,"(*ptr);");
            CodeWriter::operator+=(pCVar1,&local_1d0);
            std::__cxx11::string::~string((string *)&local_1d0);
            std::__cxx11::string::~string((string *)&local_ab0);
            std::__cxx11::string::~string((string *)&local_a70);
          }
          else {
            psVar9 = &local_1f0;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)psVar9,"      return ptr->UnPack(resolver);",
                       (allocator<char> *)&local_ab0);
            CodeWriter::operator+=(pCVar1,psVar9);
          }
        }
        std::__cxx11::string::~string((string *)psVar9);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_230,"    }",(allocator<char> *)&local_ab0);
        CodeWriter::operator+=(pCVar1,&local_230);
        std::__cxx11::string::~string((string *)&local_230);
      }
      pEVar10 = local_a78;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6f0,"    default: return nullptr;",(allocator<char> *)&local_ab0);
    CodeWriter::operator+=(pCVar1,&local_6f0);
    pCVar5 = local_a90;
    std::__cxx11::string::~string((string *)&local_6f0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_710,"  }",(allocator<char> *)&local_ab0);
    CodeWriter::operator+=(pCVar1,&local_710);
    std::__cxx11::string::~string((string *)&local_710);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_730,"}",(allocator<char> *)&local_ab0);
    CodeWriter::operator+=(pCVar1,&local_730);
    std::__cxx11::string::~string((string *)&local_730);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_750,"",(allocator<char> *)&local_ab0);
    CodeWriter::operator+=(pCVar1,&local_750);
    std::__cxx11::string::~string((string *)&local_750);
    UnionPackSignature_abi_cxx11_(&local_a70,pCVar5,pEVar10,false);
    std::operator+(&local_ab0,"inline ",&local_a70);
    std::operator+(&local_770,&local_ab0," {");
    CodeWriter::operator+=(pCVar1,&local_770);
    std::__cxx11::string::~string((string *)&local_770);
    std::__cxx11::string::~string((string *)&local_ab0);
    std::__cxx11::string::~string((string *)&local_a70);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_790,"  (void)_rehasher;",(allocator<char> *)&local_ab0);
    CodeWriter::operator+=(pCVar1,&local_790);
    std::__cxx11::string::~string((string *)&local_790);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_7b0,"  switch (type) {",(allocator<char> *)&local_ab0);
    CodeWriter::operator+=(pCVar1,&local_7b0);
    std::__cxx11::string::~string((string *)&local_7b0);
    ppEVar8 = (pEVar10->vals).vec.
              super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    while (ppEVar8 !=
           (local_a78->vals).vec.
           super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
           _M_impl.super__Vector_impl_data._M_finish) {
      local_a50 = *ppEVar8;
      local_a18 = ppEVar8;
      if (local_a50->value != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_ab0,"LABEL",(allocator<char> *)&local_a38);
        GetEnumValUse_abi_cxx11_(&local_a70,local_a90,local_a78,local_a50);
        CodeWriter::SetValue(pCVar1,&local_ab0,&local_a70);
        std::__cxx11::string::~string((string *)&local_a70);
        std::__cxx11::string::~string((string *)&local_ab0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_ab0,"TYPE",(allocator<char> *)&local_a38);
        GetUnionElement_abi_cxx11_(&local_a70,local_a90,local_a50,true,local_a40);
        CodeWriter::SetValue(pCVar1,&local_ab0,&local_a70);
        std::__cxx11::string::~string((string *)&local_a70);
        std::__cxx11::string::~string((string *)&local_ab0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_250,"    case {{LABEL}}: {",(allocator<char> *)&local_ab0);
        CodeWriter::operator+=(pCVar1,&local_250);
        std::__cxx11::string::~string((string *)&local_250);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_270,
                   "      auto ptr = reinterpret_cast<const {{TYPE}} *>(value);",
                   (allocator<char> *)&local_ab0);
        CodeWriter::operator+=(pCVar1,&local_270);
        std::__cxx11::string::~string((string *)&local_270);
        BVar2 = (local_a50->union_type).base_type;
        if (BVar2 == BASE_TYPE_STRING) {
          psVar9 = &local_2d0;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)psVar9,"      return _fbb.CreateString(*ptr).Union();",
                     (allocator<char> *)&local_ab0);
          CodeWriter::operator+=(pCVar1,psVar9);
        }
        else {
          if (BVar2 != BASE_TYPE_STRUCT) {
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_cpp.cpp"
                          ,0x6a7,
                          "void flatbuffers::cpp::CppGenerator::GenUnionPost(const EnumDef &)");
          }
          if (((local_a50->union_type).struct_def)->fixed == true) {
            psVar9 = &local_290;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)psVar9,"      return _fbb.CreateStruct(*ptr).Union();",
                       (allocator<char> *)&local_ab0);
            CodeWriter::operator+=(pCVar1,psVar9);
          }
          else {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_ab0,"NAME",(allocator<char> *)&local_a70);
            CodeWriter::SetValue(pCVar1,&local_ab0,(string *)(local_a50->union_type).struct_def);
            std::__cxx11::string::~string((string *)&local_ab0);
            psVar9 = &local_2b0;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)psVar9,"      return Create{{NAME}}(_fbb, ptr, _rehasher).Union();"
                       ,(allocator<char> *)&local_ab0);
            CodeWriter::operator+=(pCVar1,psVar9);
          }
        }
        std::__cxx11::string::~string((string *)psVar9);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2f0,"    }",(allocator<char> *)&local_ab0);
        CodeWriter::operator+=(pCVar1,&local_2f0);
        std::__cxx11::string::~string((string *)&local_2f0);
      }
      ppEVar8 = local_a18 + 1;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_7d0,"    default: return 0;",(allocator<char> *)&local_ab0);
    CodeWriter::operator+=(pCVar1,&local_7d0);
    pEVar10 = local_a78;
    std::__cxx11::string::~string((string *)&local_7d0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_7f0,"  }",(allocator<char> *)&local_ab0);
    CodeWriter::operator+=(pCVar1,&local_7f0);
    std::__cxx11::string::~string((string *)&local_7f0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_810,"}",(allocator<char> *)&local_ab0);
    CodeWriter::operator+=(pCVar1,&local_810);
    std::__cxx11::string::~string((string *)&local_810);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_830,"",(allocator<char> *)&local_ab0);
    CodeWriter::operator+=(pCVar1,&local_830);
    std::__cxx11::string::~string((string *)&local_830);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_850,
               "inline {{ENUM_NAME}}Union::{{ENUM_NAME}}Union(const {{ENUM_NAME}}Union &u) : type(u.type), value(nullptr) {"
               ,(allocator<char> *)&local_ab0);
    CodeWriter::operator+=(pCVar1,&local_850);
    std::__cxx11::string::~string((string *)&local_850);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_870,"  switch (type) {",(allocator<char> *)&local_ab0);
    CodeWriter::operator+=(pCVar1,&local_870);
    std::__cxx11::string::~string((string *)&local_870);
    local_a50 = (EnumVal *)
                (pEVar10->vals).vec.
                super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    for (ppEVar8 = (pEVar10->vals).vec.
                   super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; (EnumVal *)ppEVar8 != local_a50;
        ppEVar8 = ppEVar8 + 1) {
      if ((*ppEVar8)->value != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_ab0,"LABEL",(allocator<char> *)&local_a38);
        GetEnumValUse_abi_cxx11_(&local_a70,local_a90,local_a78,*ppEVar8);
        CodeWriter::SetValue(pCVar1,&local_ab0,&local_a70);
        std::__cxx11::string::~string((string *)&local_a70);
        std::__cxx11::string::~string((string *)&local_ab0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_ab0,"TYPE",(allocator<char> *)&local_a38);
        GetUnionElement_abi_cxx11_(&local_a70,local_a90,*ppEVar8,true,local_a40);
        CodeWriter::SetValue(pCVar1,&local_ab0,&local_a70);
        std::__cxx11::string::~string((string *)&local_a70);
        std::__cxx11::string::~string((string *)&local_ab0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_310,"    case {{LABEL}}: {",(allocator<char> *)&local_ab0);
        CodeWriter::operator+=(pCVar1,&local_310);
        std::__cxx11::string::~string((string *)&local_310);
        if (((*(int *)&(local_a90->opts_).super_IDLOptions.field_0x30c < 1) &&
            (((*ppEVar8)->union_type).base_type == BASE_TYPE_STRUCT)) &&
           (pSVar3 = ((*ppEVar8)->union_type).struct_def, pSVar3->fixed == false)) {
          for (ppFVar6 = (pSVar3->fields).vec.
                         super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              ppFVar6 !=
              (pSVar3->fields).vec.
              super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
              _M_impl.super__Vector_impl_data._M_finish; ppFVar6 = ppFVar6 + 1) {
            pFVar4 = *ppFVar6;
            if (((pFVar4->deprecated == false) &&
                ((pFVar4->value).type.struct_def != (StructDef *)0x0)) &&
               (pFVar4->native_inline != true)) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_350,
                         "      FLATBUFFERS_ASSERT(false);  // {{TYPE}} not copyable.",
                         (allocator<char> *)&local_ab0);
              CodeWriter::operator+=(pCVar1,&local_350);
              psVar9 = &local_350;
              goto LAB_0015872e;
            }
          }
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_330,
                   "      value = new {{TYPE}}(*reinterpret_cast<{{TYPE}} *>(u.value));",
                   (allocator<char> *)&local_ab0);
        CodeWriter::operator+=(pCVar1,&local_330);
        psVar9 = &local_330;
LAB_0015872e:
        std::__cxx11::string::~string((string *)psVar9);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_370,"      break;",(allocator<char> *)&local_ab0);
        CodeWriter::operator+=(pCVar1,&local_370);
        std::__cxx11::string::~string((string *)&local_370);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_390,"    }",(allocator<char> *)&local_ab0);
        CodeWriter::operator+=(pCVar1,&local_390);
        std::__cxx11::string::~string((string *)&local_390);
      }
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_890,"    default:",(allocator<char> *)&local_ab0);
    CodeWriter::operator+=(pCVar1,&local_890);
    pEVar10 = local_a78;
    pCVar5 = local_a90;
    std::__cxx11::string::~string((string *)&local_890);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_8b0,"      break;",(allocator<char> *)&local_ab0);
    CodeWriter::operator+=(pCVar1,&local_8b0);
    std::__cxx11::string::~string((string *)&local_8b0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_8d0,"  }",(allocator<char> *)&local_ab0);
    CodeWriter::operator+=(pCVar1,&local_8d0);
    std::__cxx11::string::~string((string *)&local_8d0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_8f0,"}",(allocator<char> *)&local_ab0);
    CodeWriter::operator+=(pCVar1,&local_8f0);
    std::__cxx11::string::~string((string *)&local_8f0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_910,"",(allocator<char> *)&local_ab0);
    CodeWriter::operator+=(pCVar1,&local_910);
    std::__cxx11::string::~string((string *)&local_910);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_ab0,"NONE",(allocator<char> *)&local_a70);
    pEVar7 = SymbolTable<flatbuffers::EnumVal>::Lookup(&pEVar10->vals,&local_ab0);
    if (pEVar7 == (EnumVal *)0x0) {
      __assert_fail("enum_def.Lookup(\"NONE\")",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_cpp.cpp"
                    ,0x6da,"void flatbuffers::cpp::CppGenerator::GenUnionPost(const EnumDef &)");
    }
    std::__cxx11::string::~string((string *)&local_ab0);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_ab0,"NONE",&local_a81);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a38,"NONE",&local_a41);
    pEVar7 = SymbolTable<flatbuffers::EnumVal>::Lookup(&pEVar10->vals,&local_a38);
    GetEnumValUse_abi_cxx11_(&local_a70,pCVar5,pEVar10,pEVar7);
    CodeWriter::SetValue(pCVar1,&local_ab0,&local_a70);
    std::__cxx11::string::~string((string *)&local_a70);
    std::__cxx11::string::~string((string *)&local_a38);
    std::__cxx11::string::~string((string *)&local_ab0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_930,"inline void {{ENUM_NAME}}Union::Reset() {",
               (allocator<char> *)&local_ab0);
    CodeWriter::operator+=(pCVar1,&local_930);
    std::__cxx11::string::~string((string *)&local_930);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_950,"  switch (type) {",(allocator<char> *)&local_ab0);
    CodeWriter::operator+=(pCVar1,&local_950);
    std::__cxx11::string::~string((string *)&local_950);
    for (ppEVar8 = (pEVar10->vals).vec.
                   super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppEVar8 !=
        (local_a78->vals).vec.
        super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>._M_impl.
        super__Vector_impl_data._M_finish; ppEVar8 = ppEVar8 + 1) {
      pEVar7 = *ppEVar8;
      if (pEVar7->value != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_ab0,"LABEL",(allocator<char> *)&local_a38);
        GetEnumValUse_abi_cxx11_(&local_a70,local_a90,local_a78,pEVar7);
        CodeWriter::SetValue(pCVar1,&local_ab0,&local_a70);
        std::__cxx11::string::~string((string *)&local_a70);
        std::__cxx11::string::~string((string *)&local_ab0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_ab0,"TYPE",(allocator<char> *)&local_a38);
        GetUnionElement_abi_cxx11_(&local_a70,local_a90,pEVar7,true,local_a40);
        CodeWriter::SetValue(pCVar1,&local_ab0,&local_a70);
        std::__cxx11::string::~string((string *)&local_a70);
        std::__cxx11::string::~string((string *)&local_ab0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3b0,"    case {{LABEL}}: {",(allocator<char> *)&local_ab0);
        CodeWriter::operator+=(pCVar1,&local_3b0);
        std::__cxx11::string::~string((string *)&local_3b0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3d0,"      auto ptr = reinterpret_cast<{{TYPE}} *>(value);",
                   (allocator<char> *)&local_ab0);
        CodeWriter::operator+=(pCVar1,&local_3d0);
        std::__cxx11::string::~string((string *)&local_3d0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3f0,"      delete ptr;",(allocator<char> *)&local_ab0);
        CodeWriter::operator+=(pCVar1,&local_3f0);
        std::__cxx11::string::~string((string *)&local_3f0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_410,"      break;",(allocator<char> *)&local_ab0);
        CodeWriter::operator+=(pCVar1,&local_410);
        std::__cxx11::string::~string((string *)&local_410);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_430,"    }",(allocator<char> *)&local_ab0);
        CodeWriter::operator+=(pCVar1,&local_430);
        std::__cxx11::string::~string((string *)&local_430);
      }
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_970,"    default: break;",(allocator<char> *)&local_ab0);
    CodeWriter::operator+=(pCVar1,&local_970);
    std::__cxx11::string::~string((string *)&local_970);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_990,"  }",(allocator<char> *)&local_ab0);
    CodeWriter::operator+=(pCVar1,&local_990);
    std::__cxx11::string::~string((string *)&local_990);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_9b0,"  value = nullptr;",(allocator<char> *)&local_ab0);
    CodeWriter::operator+=(pCVar1,&local_9b0);
    std::__cxx11::string::~string((string *)&local_9b0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_9d0,"  type = {{NONE}};",(allocator<char> *)&local_ab0);
    CodeWriter::operator+=(pCVar1,&local_9d0);
    std::__cxx11::string::~string((string *)&local_9d0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_9f0,"}",(allocator<char> *)&local_ab0);
    CodeWriter::operator+=(pCVar1,&local_9f0);
    std::__cxx11::string::~string((string *)&local_9f0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a10,"",(allocator<char> *)&local_ab0);
    CodeWriter::operator+=(pCVar1,&local_a10);
    std::__cxx11::string::~string((string *)&local_a10);
  }
  return;
}

Assistant:

void GenUnionPost(const EnumDef &enum_def) {
    // Generate a verifier function for this union that can be called by the
    // table verifier functions. It uses a switch case to select a specific
    // verifier function to call, this should be safe even if the union type
    // has been corrupted, since the verifiers will simply fail when called
    // on the wrong type.
    code_.SetValue("ENUM_NAME", Name(enum_def));

    code_ += "inline " + UnionVerifySignature(enum_def) + " {";
    code_ += "  switch (type) {";
    for (auto it = enum_def.Vals().begin(); it != enum_def.Vals().end(); ++it) {
      const auto &ev = **it;
      code_.SetValue("LABEL", GetEnumValUse(enum_def, ev));

      if (ev.IsNonZero()) {
        code_.SetValue("TYPE", GetUnionElement(ev, false, opts_));
        code_ += "    case {{LABEL}}: {";
        auto getptr =
            "      auto ptr = reinterpret_cast<const {{TYPE}} *>(obj);";
        if (ev.union_type.base_type == BASE_TYPE_STRUCT) {
          if (ev.union_type.struct_def->fixed) {
            code_.SetValue("ALIGN",
                           NumToString(ev.union_type.struct_def->minalign));
            code_ +=
                "      return verifier.VerifyField<{{TYPE}}>("
                "static_cast<const uint8_t *>(obj), 0, {{ALIGN}});";
          } else {
            code_ += getptr;
            code_ += "      return verifier.VerifyTable(ptr);";
          }
        } else if (IsString(ev.union_type)) {
          code_ += getptr;
          code_ += "      return verifier.VerifyString(ptr);";
        } else {
          FLATBUFFERS_ASSERT(false);
        }
        code_ += "    }";
      } else {
        code_ += "    case {{LABEL}}: {";
        code_ += "      return true;";  // "NONE" enum value.
        code_ += "    }";
      }
    }
    code_ += "    default: return true;";  // unknown values are OK.
    code_ += "  }";
    code_ += "}";
    code_ += "";

    code_ += "inline " + UnionVectorVerifySignature(enum_def) + " {";
    code_ += "  if (!values || !types) return !values && !types;";
    code_ += "  if (values->size() != types->size()) return false;";
    code_ +=
        "  for (::flatbuffers::uoffset_t i = 0; i < values->size(); ++i) {";
    code_ += "    if (!Verify" + Name(enum_def) + "(";
    code_ += "        verifier,  values->Get(i), types->GetEnum<" +
             Name(enum_def) + ">(i))) {";
    code_ += "      return false;";
    code_ += "    }";
    code_ += "  }";
    code_ += "  return true;";
    code_ += "}";
    code_ += "";

    if (opts_.generate_object_based_api) {
      // Generate union Unpack() and Pack() functions.
      code_ += "inline " + UnionUnPackSignature(enum_def, false) + " {";
      code_ += "  (void)resolver;";
      code_ += "  switch (type) {";
      for (auto it = enum_def.Vals().begin(); it != enum_def.Vals().end();
           ++it) {
        const auto &ev = **it;
        if (ev.IsZero()) { continue; }

        code_.SetValue("LABEL", GetEnumValUse(enum_def, ev));
        code_.SetValue("TYPE", GetUnionElement(ev, false, opts_));
        code_ += "    case {{LABEL}}: {";
        code_ += "      auto ptr = reinterpret_cast<const {{TYPE}} *>(obj);";
        if (ev.union_type.base_type == BASE_TYPE_STRUCT) {
          if (ev.union_type.struct_def->fixed) {
            code_ += "      return new " +
                     WrapInNameSpace(*ev.union_type.struct_def) + "(*ptr);";
          } else {
            code_ += "      return ptr->UnPack(resolver);";
          }
        } else if (IsString(ev.union_type)) {
          code_ += "      return new std::string(ptr->c_str(), ptr->size());";
        } else {
          FLATBUFFERS_ASSERT(false);
        }
        code_ += "    }";
      }
      code_ += "    default: return nullptr;";
      code_ += "  }";
      code_ += "}";
      code_ += "";

      code_ += "inline " + UnionPackSignature(enum_def, false) + " {";
      code_ += "  (void)_rehasher;";
      code_ += "  switch (type) {";
      for (auto it = enum_def.Vals().begin(); it != enum_def.Vals().end();
           ++it) {
        auto &ev = **it;
        if (ev.IsZero()) { continue; }

        code_.SetValue("LABEL", GetEnumValUse(enum_def, ev));
        code_.SetValue("TYPE", GetUnionElement(ev, true, opts_));
        code_ += "    case {{LABEL}}: {";
        code_ += "      auto ptr = reinterpret_cast<const {{TYPE}} *>(value);";
        if (ev.union_type.base_type == BASE_TYPE_STRUCT) {
          if (ev.union_type.struct_def->fixed) {
            code_ += "      return _fbb.CreateStruct(*ptr).Union();";
          } else {
            code_.SetValue("NAME", ev.union_type.struct_def->name);
            code_ +=
                "      return Create{{NAME}}(_fbb, ptr, _rehasher).Union();";
          }
        } else if (IsString(ev.union_type)) {
          code_ += "      return _fbb.CreateString(*ptr).Union();";
        } else {
          FLATBUFFERS_ASSERT(false);
        }
        code_ += "    }";
      }
      code_ += "    default: return 0;";
      code_ += "  }";
      code_ += "}";
      code_ += "";

      // Union copy constructor
      code_ +=
          "inline {{ENUM_NAME}}Union::{{ENUM_NAME}}Union(const "
          "{{ENUM_NAME}}Union &u) : type(u.type), value(nullptr) {";
      code_ += "  switch (type) {";
      for (const auto &ev : enum_def.Vals()) {
        if (ev->IsZero()) { continue; }
        code_.SetValue("LABEL", GetEnumValUse(enum_def, *ev));
        code_.SetValue("TYPE", GetUnionElement(*ev, true, opts_));
        code_ += "    case {{LABEL}}: {";
        bool copyable = true;
        if (opts_.g_cpp_std < cpp::CPP_STD_11 &&
            ev->union_type.base_type == BASE_TYPE_STRUCT &&
            !ev->union_type.struct_def->fixed) {
          // Don't generate code to copy if table is not copyable.
          // TODO(wvo): make tables copyable instead.
          for (const auto &field : ev->union_type.struct_def->fields.vec) {
            if (!field->deprecated && field->value.type.struct_def &&
                !field->native_inline) {
              copyable = false;
              break;
            }
          }
        }
        if (copyable) {
          code_ +=
              "      value = new {{TYPE}}(*reinterpret_cast<{{TYPE}} *>"
              "(u.value));";
        } else {
          code_ +=
              "      FLATBUFFERS_ASSERT(false);  // {{TYPE}} not copyable.";
        }
        code_ += "      break;";
        code_ += "    }";
      }
      code_ += "    default:";
      code_ += "      break;";
      code_ += "  }";
      code_ += "}";
      code_ += "";

      // Union Reset() function.
      FLATBUFFERS_ASSERT(enum_def.Lookup("NONE"));
      code_.SetValue("NONE", GetEnumValUse(enum_def, *enum_def.Lookup("NONE")));

      code_ += "inline void {{ENUM_NAME}}Union::Reset() {";
      code_ += "  switch (type) {";
      for (auto it = enum_def.Vals().begin(); it != enum_def.Vals().end();
           ++it) {
        const auto &ev = **it;
        if (ev.IsZero()) { continue; }
        code_.SetValue("LABEL", GetEnumValUse(enum_def, ev));
        code_.SetValue("TYPE", GetUnionElement(ev, true, opts_));
        code_ += "    case {{LABEL}}: {";
        code_ += "      auto ptr = reinterpret_cast<{{TYPE}} *>(value);";
        code_ += "      delete ptr;";
        code_ += "      break;";
        code_ += "    }";
      }
      code_ += "    default: break;";
      code_ += "  }";
      code_ += "  value = nullptr;";
      code_ += "  type = {{NONE}};";
      code_ += "}";
      code_ += "";
    }
  }